

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

any * __thiscall
Omega_h::InputYamlReader::at_shift
          (any *__return_storage_ptr__,InputYamlReader *this,int token,string *text)

{
  char *value;
  string *text_local;
  int token_local;
  InputYamlReader *this_local;
  
  if (token == 0) {
    any::any<std::__cxx11::string,void>(__return_storage_ptr__,text);
  }
  else if ((token == 3) || (token == 0x13)) {
    value = (char *)std::__cxx11::string::at((ulong)text);
    any::any<char&,void>(__return_storage_ptr__,value);
  }
  else {
    any::any(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

any at_shift(int token, std::string& text) override final {
    switch (token) {
      case yaml::TOK_NEWLINE: {
        return any(std::move(text));
      }
      case yaml::TOK_SPACE:
      case yaml::TOK_OTHER: {
        return text.at(0);
      }
    }
    return any();
  }